

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O2

map<strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>_>_>_>
* __thiscall
grammar::nonterminal_keys_abi_cxx11_
          (map<strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>_>_>_>
           *__return_storage_ptr__,grammar *this)

{
  _Rb_tree_header *p_Var1;
  mapped_type *__args_1;
  pointer psVar2;
  strong_t<int,_grammar::token_tag> nonterm;
  vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
  nonterms;
  key_type local_44;
  _Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
  local_40;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  nonterminals((vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                *)&local_40,this);
  for (psVar2 = local_40._M_impl.super__Vector_impl_data._M_start;
      psVar2 != local_40._M_impl.super__Vector_impl_data._M_finish; psVar2 = psVar2 + 1) {
    local_44.internal_rep = psVar2->internal_rep;
    __args_1 = std::
               map<strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>_>_>_>
               ::at(&this->symbols,&local_44);
    std::
    _Rb_tree<strong_t<int,grammar::token_tag>,std::pair<strong_t<int,grammar::token_tag>const,strong_t<std::__cxx11::string,grammar::symbol_tag>>,std::_Select1st<std::pair<strong_t<int,grammar::token_tag>const,strong_t<std::__cxx11::string,grammar::symbol_tag>>>,std::less<strong_t<int,grammar::token_tag>>,std::allocator<std::pair<strong_t<int,grammar::token_tag>const,strong_t<std::__cxx11::string,grammar::symbol_tag>>>>
    ::
    _M_emplace_unique<strong_t<int,grammar::token_tag>const&,strong_t<std::__cxx11::string,grammar::symbol_tag>const&>
              ((_Rb_tree<strong_t<int,grammar::token_tag>,std::pair<strong_t<int,grammar::token_tag>const,strong_t<std::__cxx11::string,grammar::symbol_tag>>,std::_Select1st<std::pair<strong_t<int,grammar::token_tag>const,strong_t<std::__cxx11::string,grammar::symbol_tag>>>,std::less<strong_t<int,grammar::token_tag>>,std::allocator<std::pair<strong_t<int,grammar::token_tag>const,strong_t<std::__cxx11::string,grammar::symbol_tag>>>>
                *)__return_storage_ptr__,&local_44,__args_1);
  }
  std::
  _Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
  ::~_Vector_base(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::map<token_t, symbol_t> grammar::nonterminal_keys() const {
    std::map<token_t, symbol_t> to_ret;
    auto                        nonterms = this->nonterminals();
    for (const auto nonterm : nonterms)
        to_ret.emplace(nonterm, symbols.at(nonterm));

    return to_ret;
}